

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O2

optional<unsigned_char> __thiscall wasm::WATParser::Lexer::takeI<unsigned_char>(Lexer *this)

{
  bool bVar1;
  _Optional_payload_base<unsigned_char> _Var2;
  string_view in;
  undefined1 local_40 [8];
  optional<wasm::WATParser::(anonymous_namespace)::LexIntResult> result;
  
  in = next(this);
  anon_unknown_0::integer
            ((optional<wasm::WATParser::(anonymous_namespace)::LexIntResult> *)local_40,in);
  if (result.super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>.
      _M_payload.super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>.
      _M_payload._M_value.sign._0_1_ == '\x01') {
    if (result.
        super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>.
        _M_payload.
        super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>.
        _M_payload._M_value.n._0_4_ != 0 ||
        (char *)0xff <
        result.
        super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>.
        _M_payload.
        super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>.
        _M_payload._M_value.super_LexResult.span._M_str) {
      bVar1 = result.
              super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>
              ._M_payload.
              super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>.
              _M_payload._M_value.super_LexResult.span._M_str + 0x80 < (char *)0x81;
      if (result.
          super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>.
          _M_payload.
          super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>.
          _M_payload._M_value.n._0_4_ != 2) {
        bVar1 = result.
                super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>
                ._M_payload.
                super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>.
                _M_payload._M_value.super_LexResult.span._M_str < (char *)0x80;
      }
      if (!bVar1) goto LAB_00c02d31;
    }
    this->pos = this->pos + (long)local_40;
    advance(this);
    _Var2 = (_Optional_payload_base<unsigned_char>)
            ((ushort)result.
                     super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>
                     ._M_payload.
                     super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>
                     ._M_payload._M_value.super_LexResult.span._M_str & 0xff | 0x100);
  }
  else {
LAB_00c02d31:
    _Var2._M_payload = (_Storage<unsigned_char,_true>)0x0;
    _Var2._M_engaged = false;
  }
  return (_Optional_base<unsigned_char,_true,_true>)(_Optional_base<unsigned_char,_true,_true>)_Var2
  ;
}

Assistant:

std::optional<T> Lexer::takeI() {
  static_assert(std::is_integral_v<T> && std::is_unsigned_v<T>);
  if (auto result = integer(next())) {
    if (result->isUnsigned<T>() || result->isSigned<std::make_signed_t<T>>()) {
      pos += result->span.size();
      advance();
      return T(result->n);
    }
  }
  return std::nullopt;
}